

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

RegSlot __thiscall
ByteCodeGenerator::EnregisterBigIntConstant(ByteCodeGenerator *this,ParseNode *pnode)

{
  Type pFVar1;
  bool bVar2;
  Type *ppFVar3;
  FuncInfo *top;
  ParseNode *pPStack_18;
  RegSlot loc;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  top._4_4_ = 0xffffffff;
  pPStack_18 = pnode;
  pnode_local = (ParseNode *)this;
  ppFVar3 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  pFVar1 = *ppFVar3;
  bVar2 = JsUtil::
          BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<ParseNode*>
                    ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&pFVar1->bigintToRegister,&stack0xffffffffffffffe8,(uint *)((long)&top + 4))
  ;
  if (!bVar2) {
    top._4_4_ = NextConstRegister(this);
    JsUtil::
    BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(&pFVar1->bigintToRegister,&stack0xffffffffffffffe8,(uint *)((long)&top + 4));
  }
  return top._4_4_;
}

Assistant:

Js::RegSlot ByteCodeGenerator::EnregisterBigIntConstant(ParseNode* pnode)
{
    Js::RegSlot loc = Js::Constants::NoRegister;
    FuncInfo *top = funcInfoStack->Top();
    if (!top->bigintToRegister.TryGetValue(pnode, &loc))
    {
        loc = NextConstRegister();
        top->bigintToRegister.Add(pnode, loc);
    }
    return loc;
}